

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kwsGenerator.cxx
# Opt level: O1

void __thiscall kws::Generator::Generator(Generator *this)

{
  (this->m_ProjectTitle)._M_dataplus._M_p = (pointer)&(this->m_ProjectTitle).field_2;
  (this->m_ProjectTitle)._M_string_length = 0;
  (this->m_ProjectTitle).field_2._M_local_buf[0] = '\0';
  (this->m_ProjectLogo)._M_dataplus._M_p = (pointer)&(this->m_ProjectLogo).field_2;
  (this->m_ProjectLogo)._M_string_length = 0;
  (this->m_ProjectLogo).field_2._M_local_buf[0] = '\0';
  (this->m_KWStyleLogo)._M_dataplus._M_p = (pointer)&(this->m_KWStyleLogo).field_2;
  (this->m_KWStyleLogo)._M_string_length = 0;
  (this->m_KWStyleLogo).field_2._M_local_buf[0] = '\0';
  this->m_Parsers = (ParserVectorType *)0x0;
  std::__cxx11::string::_M_replace((ulong)&this->m_ProjectTitle,0,(char *)0x0,0x16b513);
  std::__cxx11::string::_M_replace
            ((ulong)&this->m_ProjectLogo,0,(char *)(this->m_ProjectLogo)._M_string_length,0x177280);
  std::__cxx11::string::_M_replace
            ((ulong)&this->m_KWStyleLogo,0,(char *)(this->m_KWStyleLogo)._M_string_length,0x177289);
  this->m_MaxDirectoryDepth = 99;
  this->m_ErrorThreshold = 0;
  return;
}

Assistant:

Generator::Generator()
{
  m_Parsers = nullptr;
  m_ProjectTitle = "";
  m_ProjectLogo = "Logo.gif";
  m_KWStyleLogo = "kwstylelogo.jpg";
  m_MaxDirectoryDepth = 99;
  m_ErrorThreshold = 0;
}